

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall
QPDF::checkHPageOffset
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *shared_idx_to_obj)

{
  int *i_00;
  int __val;
  const_reference pvVar1;
  size_type sVar2;
  qpdf_offset_t qVar3;
  unsigned_long uVar4;
  QPDFObjGen QVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  mapped_type *__v;
  reference pvVar9;
  size_type sVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  size_t i_1;
  long lVar13;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar14;
  size_t i;
  ulong uVar15;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var16;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  int local_214;
  int obj;
  undefined4 uStack_20c;
  size_t local_208;
  set<int,_std::less<int>,_std::allocator<int>_> hint_shared;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int local_19c;
  set<int,_std::less<int>,_std::allocator<int>_> computed_shared;
  string local_168;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_148;
  reference local_140;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_138;
  string local_130;
  string local_110;
  QPDFObjGen page_og;
  int iter;
  qpdf_offset_t local_c8;
  QPDFObjGen local_c0;
  QPDFObjGen first_page_og;
  int idx;
  string local_90;
  string local_70;
  string local_50;
  
  hint_shared._M_t._M_impl._0_8_ =
       (long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_start >> 4;
  local_148 = pages;
  local_138 = shared_idx_to_obj;
  local_19c = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                        ((unsigned_long *)&hint_shared);
  _Var16._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  lVar13 = *(qpdf_offset_t *)((long)&(_Var16._M_head_impl)->page_offset_hints + 8);
  if (*(qpdf_offset_t *)((long)&(_Var16._M_head_impl)->linp + 0x30) <= lVar13) {
    lVar13 = lVar13 + *(qpdf_offset_t *)((long)&(_Var16._M_head_impl)->linp + 0x38);
  }
  pvVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_148,0);
  first_page_og = QPDFObjectHandle::getObjGen(pvVar1);
  sVar2 = std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::count(&((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,
                  &first_page_og);
  if (sVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&hint_shared,"supposed first page object is not known",
               (allocator<char> *)&computed_shared);
    stopOnError(this,(string *)&hint_shared);
    std::__cxx11::string::~string((string *)&hint_shared);
  }
  qVar3 = getLinearizationOffset(this,first_page_og);
  if (lVar13 != qVar3) {
    msg._M_str = "first page object offset mismatch";
    msg._M_len = 0x21;
    linearizationWarning(this,msg);
  }
  for (local_214 = 0; local_214 < local_19c; local_214 = local_214 + 1) {
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_214);
    pvVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_148,uVar4);
    QVar5 = QPDFObjectHandle::getObjGen(pvVar1);
    page_og = QVar5;
    sVar2 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count(&((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,
                    &page_og);
    if (sVar2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hint_shared,"unknown object in page offset hint table",
                 (allocator<char> *)&computed_shared);
      stopOnError(this,(string *)&hint_shared);
      std::__cxx11::string::~string((string *)&hint_shared);
    }
    local_c0 = QVar5;
    local_c8 = getLinearizationOffset(this,page_og);
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_214);
    pvVar6 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       ((vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
                        ((long)&(_Var16._M_head_impl)->page_offset_hints + 0x40),uVar4);
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_214);
    local_140 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                          (&((_Var16._M_head_impl)->c_page_offset_data).entries,uVar4);
    iVar14 = (((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->page_offset_hints).
             min_nobjects + pvVar6->delta_nobjects;
    if (iVar14 != local_140->nobjects) {
      std::__cxx11::to_string(&local_110,local_214);
      std::operator+(&local_1c0,"object count mismatch for page ",&local_110);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     &local_1c0,": hint table = ");
      std::__cxx11::to_string(&local_168,iVar14);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     &local_168);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &computed_shared,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                     "; computed = ");
      std::__cxx11::to_string(&local_130,local_140->nobjects);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &hint_shared,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &computed_shared,&local_130);
      msg_00._M_len._4_4_ = hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      msg_00._M_len._0_4_ = hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      msg_00._M_str = (char *)hint_shared._M_t._M_impl._0_8_;
      linearizationWarning(this,msg_00);
      std::__cxx11::string::~string((string *)&hint_shared);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&computed_shared);
      std::__cxx11::string::~string((string *)&obj);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&idx);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    iVar14 = lengthNextN(this,local_c0.obj,iVar14);
    hint_shared._M_t._M_impl._0_8_ =
         (long)*(int *)((long)&((this->m)._M_t.
                                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                               page_offset_hints + 0x14) + pvVar6->delta_page_length;
    __val = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)&hint_shared);
    if (iVar14 != __val) {
      std::__cxx11::to_string((string *)&iter,local_214);
      std::operator+(&local_130,"page length mismatch for page ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter);
      std::operator+(&local_168,&local_130,": hint table = ");
      std::__cxx11::to_string(&local_50,__val);
      std::operator+(&local_110,&local_168,&local_50);
      std::operator+(&local_1c0,&local_110,"; computed length = ");
      std::__cxx11::to_string(&local_70,iVar14);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     &local_1c0,&local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     " (offset = ");
      std::__cxx11::to_string(&local_90,local_c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &computed_shared,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                     &local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &hint_shared,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &computed_shared,")");
      msg_01._M_len._4_4_ = hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
      msg_01._M_len._0_4_ = hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      msg_01._M_str = (char *)hint_shared._M_t._M_impl._0_8_;
      linearizationWarning(this,msg_01);
      std::__cxx11::string::~string((string *)&hint_shared);
      std::__cxx11::string::~string((string *)&computed_shared);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&obj);
      std::__cxx11::string::~string((string *)&idx);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&iter);
    }
    hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &hint_shared._M_t._M_impl.super__Rb_tree_header._M_header;
    hint_shared._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    computed_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    computed_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    computed_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &computed_shared._M_t._M_impl.super__Rb_tree_header._M_header;
    computed_shared._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    computed_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         computed_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((local_214 == 0) && (0 < pvVar6->nshared_objects)) {
      msg_02._M_str = "page 0 has shared identifier entries";
      msg_02._M_len = 0x24;
      linearizationWarning(this,msg_02);
    }
    for (uVar15 = 0;
        uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                          (&pvVar6->nshared_objects), uVar15 < uVar4; uVar15 = uVar15 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(&pvVar6->shared_identifiers,uVar15);
      idx = *pvVar7;
      sVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                        (local_138,(key_type *)&idx);
      if (sVar8 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&obj,"unable to get object for item in shared objects hint table",
                   (allocator<char> *)&local_1c0);
        stopOnError(this,(string *)&obj);
        std::__cxx11::string::~string((string *)&obj);
      }
      __v = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[](local_138,(key_type *)&idx);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &hint_shared,__v);
    }
    i_00 = &local_140->nshared_objects;
    this_00 = &local_140->shared_identifiers;
    for (uVar15 = 0; uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(i_00),
        p_Var11 = hint_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_left, uVar15 < uVar4;
        uVar15 = uVar15 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(this_00,uVar15);
      idx = *pvVar7;
      _Var16._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      if (*(int *)((long)&(_Var16._M_head_impl)->c_shared_object_data + 8) <= idx) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&obj,"index out of bounds for shared object hint table",
                   (allocator<char> *)&local_1c0);
        stopOnError(this,(string *)&obj);
        std::__cxx11::string::~string((string *)&obj);
        _Var16._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      }
      uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&idx);
      pvVar9 = std::vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>::
               at(&((_Var16._M_head_impl)->c_shared_object_data).entries,uVar4);
      obj = pvVar9->object;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &computed_shared,&obj);
    }
    for (; p_Var12 = computed_shared._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        (_Rb_tree_header *)p_Var11 != &hint_shared._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      iter = p_Var11[1]._M_color;
      sVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&computed_shared,&iter);
      if (sVar10 == 0) {
        std::__cxx11::to_string(&local_168,local_214);
        std::operator+(&local_110,"page ",&local_168);
        std::operator+(&local_1c0,&local_110,": shared object ");
        std::__cxx11::to_string(&local_130,iter);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                       &local_1c0,&local_130);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                       ": in hint table but not computed list");
        msg_03._M_str._4_4_ = uStack_20c;
        msg_03._M_str._0_4_ = obj;
        msg_03._M_len = local_208;
        linearizationWarning(this,msg_03);
        std::__cxx11::string::~string((string *)&obj);
        std::__cxx11::string::~string((string *)&idx);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_168);
      }
    }
    for (; (_Rb_tree_header *)p_Var12 != &computed_shared._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
      iter = p_Var12[1]._M_color;
      sVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&hint_shared,&iter);
      if (sVar10 == 0) {
        std::__cxx11::to_string(&local_168,local_214);
        std::operator+(&local_110,"page ",&local_168);
        std::operator+(&local_1c0,&local_110,": shared object ");
        std::__cxx11::to_string(&local_130,iter);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                       &local_1c0,&local_130);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                       ": in computed list but not hint table");
        msg_04._M_str._4_4_ = uStack_20c;
        msg_04._M_str._0_4_ = obj;
        msg_04._M_len = local_208;
        linearizationWarning(this,msg_04);
        std::__cxx11::string::~string((string *)&obj);
        std::__cxx11::string::~string((string *)&idx);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_168);
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&computed_shared._M_t);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&hint_shared._M_t);
  }
  return;
}

Assistant:

void
QPDF::checkHPageOffset(
    std::vector<QPDFObjectHandle> const& pages, std::map<int, int>& shared_idx_to_obj)
{
    // Implementation note 126 says Acrobat always sets delta_content_offset and
    // delta_content_length in the page offset header dictionary to 0.  It also states that
    // min_content_offset in the per-page information is always 0, which is an incorrect value.

    // Implementation note 127 explains that Acrobat always sets item 8 (min_content_length) to
    // zero, item 9 (nbits_delta_content_length) to the value of item 5 (nbits_delta_page_length),
    // and item 7 of each per-page hint table (delta_content_length) to item 2 (delta_page_length)
    // of that entry.  Acrobat ignores these values when reading files.

    // Empirically, it also seems that Acrobat sometimes puts items under a page's /Resources
    // dictionary in with shared objects even when they are private.

    int npages = toI(pages.size());
    qpdf_offset_t table_offset = adjusted_offset(m->page_offset_hints.first_page_offset);
    QPDFObjGen first_page_og(pages.at(0).getObjGen());
    if (m->xref_table.count(first_page_og) == 0) {
        stopOnError("supposed first page object is not known");
    }
    qpdf_offset_t offset = getLinearizationOffset(first_page_og);
    if (table_offset != offset) {
        linearizationWarning("first page object offset mismatch");
    }

    for (int pageno = 0; pageno < npages; ++pageno) {
        QPDFObjGen page_og(pages.at(toS(pageno)).getObjGen());
        int first_object = page_og.getObj();
        if (m->xref_table.count(page_og) == 0) {
            stopOnError("unknown object in page offset hint table");
        }
        offset = getLinearizationOffset(page_og);

        HPageOffsetEntry& he = m->page_offset_hints.entries.at(toS(pageno));
        CHPageOffsetEntry& ce = m->c_page_offset_data.entries.at(toS(pageno));
        int h_nobjects = he.delta_nobjects + m->page_offset_hints.min_nobjects;
        if (h_nobjects != ce.nobjects) {
            // This happens with pdlin when there are thumbnails.
            linearizationWarning(
                "object count mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_nobjects) + "; computed = " + std::to_string(ce.nobjects));
        }

        // Use value for number of objects in hint table rather than computed value if there is a
        // discrepancy.
        int length = lengthNextN(first_object, h_nobjects);
        int h_length = toI(he.delta_page_length + m->page_offset_hints.min_page_length);
        if (length != h_length) {
            // This condition almost certainly indicates a bad hint table or a bug in this code.
            linearizationWarning(
                "page length mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_length) + "; computed length = " + std::to_string(length) +
                " (offset = " + std::to_string(offset) + ")");
        }

        offset += h_length;

        // Translate shared object indexes to object numbers.
        std::set<int> hint_shared;
        std::set<int> computed_shared;

        if ((pageno == 0) && (he.nshared_objects > 0)) {
            // pdlin and Acrobat both do this even though the spec states clearly and unambiguously
            // that they should not.
            linearizationWarning("page 0 has shared identifier entries");
        }

        for (size_t i = 0; i < toS(he.nshared_objects); ++i) {
            int idx = he.shared_identifiers.at(i);
            if (shared_idx_to_obj.count(idx) == 0) {
                stopOnError("unable to get object for item in shared objects hint table");
            }
            hint_shared.insert(shared_idx_to_obj[idx]);
        }

        for (size_t i = 0; i < toS(ce.nshared_objects); ++i) {
            int idx = ce.shared_identifiers.at(i);
            if (idx >= m->c_shared_object_data.nshared_total) {
                stopOnError("index out of bounds for shared object hint table");
            }
            int obj = m->c_shared_object_data.entries.at(toS(idx)).object;
            computed_shared.insert(obj);
        }

        for (int iter: hint_shared) {
            if (!computed_shared.count(iter)) {
                // pdlin puts thumbnails here even though it shouldn't
                linearizationWarning(
                    "page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                    ": in hint table but not computed list");
            }
        }

        for (int iter: computed_shared) {
            if (!hint_shared.count(iter)) {
                // Acrobat does not put some things including at least built-in fonts and procsets
                // here, at least in some cases.
                linearizationWarning(
                    ("page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                     ": in computed list but not hint table"));
            }
        }
    }
}